

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

int sas_client_init(sas_client *client,rxc_sink *sink)

{
  client->fd = -1;
  client->sink = sink;
  (client->session).seq = 0;
  (client->session).ack = 0;
  (client->session).state = '\0';
  (client->session).send_window = 0;
  (client->session).receive_window = 0x400;
  (client->session).pipeline = (rxc_pipeline *)0x0;
  (client->session).sink_logic = (rxc_sink_logic *)0x0;
  return 0;
}

Assistant:

int sas_client_init(struct sas_client *client, struct rxc_sink *sink)
{
    client->fd = -1;
    client->sink = sink;

    client->session.seq = 0;
    client->session.ack = 0;
    client->session.state = SAS_TRANSPORT_STATE_INITIAL;
    client->session.send_window = 0;
    client->session.receive_window = SAS_CLIENT_SESSION_WINDOW_SIZE;
    client->session.pipeline = NULL;
    client->session.sink_logic = NULL;

    return 0;
}